

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

Vec_Ptr_t * Aig_ManReduceLachesOnce(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p_00;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *Entry;
  Aig_Obj_t *pAVar5;
  int local_44;
  int i;
  int *pMapping;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vMap;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManCiNum(p);
  p_00 = Vec_PtrAlloc(iVar1);
  local_44 = 0;
  while( true ) {
    iVar1 = Aig_ManCiNum(p);
    iVar2 = Aig_ManRegNum(p);
    if (iVar1 - iVar2 <= local_44) break;
    pvVar3 = Vec_PtrEntry(p->vCis,local_44);
    Vec_PtrPush(p_00,pvVar3);
    local_44 = local_44 + 1;
  }
  iVar1 = Aig_ManObjNumMax(p);
  pvVar3 = malloc((long)(iVar1 << 1) << 2);
  iVar1 = Aig_ManObjNumMax(p);
  memset(pvVar3,0xff,(long)(iVar1 << 1) << 2);
  for (local_44 = 0; iVar1 = Aig_ManRegNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar4 = Aig_ManLi(p,local_44);
    Entry = Aig_ManLo(p,local_44);
    pAVar5 = Aig_ObjFanin0(pAVar4);
    iVar1 = Aig_ObjFaninC0(pAVar4);
    if (iVar1 == 0) {
      if ((*(ulong *)&pAVar5->field_0x18 >> 4 & 1) == 0) {
        *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffef | 0x10;
        *(int *)((long)pvVar3 + (long)(pAVar5->Id << 1) * 4) = local_44;
        Vec_PtrPush(p_00,Entry);
      }
      else {
        pAVar4 = Aig_ManLo(p,*(int *)((long)pvVar3 + (long)(pAVar5->Id << 1) * 4));
        Vec_PtrPush(p_00,pAVar4);
      }
    }
    else if ((*(ulong *)&pAVar5->field_0x18 >> 5 & 1) == 0) {
      *(ulong *)&pAVar5->field_0x18 = *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffdf | 0x20;
      *(int *)((long)pvVar3 + (long)(pAVar5->Id * 2 + 1) * 4) = local_44;
      Vec_PtrPush(p_00,Entry);
    }
    else {
      pAVar4 = Aig_ManLo(p,*(int *)((long)pvVar3 + (long)(pAVar5->Id * 2 + 1) * 4));
      Vec_PtrPush(p_00,pAVar4);
    }
  }
  if (pvVar3 != (void *)0x0) {
    free(pvVar3);
  }
  local_44 = Aig_ManCoNum(p);
  iVar1 = Aig_ManRegNum(p);
  for (local_44 = local_44 - iVar1; iVar1 = Vec_PtrSize(p->vCos), local_44 < iVar1;
      local_44 = local_44 + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_44);
    pAVar4 = Aig_ObjFanin0(pAVar4);
    *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffdf;
    *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xffffffffffffffef;
  }
  return p_00;
}

Assistant:

Vec_Ptr_t * Aig_ManReduceLachesOnce( Aig_Man_t * p )
{
    Vec_Ptr_t * vMap;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pFanin;
    int * pMapping, i;
    // start mapping by adding the true PIs
    vMap = Vec_PtrAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Vec_PtrPush( vMap, pObj );
    // create mapping of fanin nodes into the corresponding latch outputs
    pMapping = ABC_FALLOC( int, 2 * Aig_ManObjNumMax(p) );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        pFanin = Aig_ObjFanin0(pObjLi);
        if ( Aig_ObjFaninC0(pObjLi) )
        {
            if ( pFanin->fMarkB )
            {
                Vec_PtrPush( vMap, Aig_ManLo(p, pMapping[2*pFanin->Id + 1]) );
            }
            else
            {
                pFanin->fMarkB = 1;
                pMapping[2*pFanin->Id + 1] = i;
                Vec_PtrPush( vMap, pObjLo );
            }
        }
        else
        {
            if ( pFanin->fMarkA )
            {
                Vec_PtrPush( vMap, Aig_ManLo(p, pMapping[2*pFanin->Id]) );
            }
            else
            {
                pFanin->fMarkA = 1;
                pMapping[2*pFanin->Id] = i;
                Vec_PtrPush( vMap, pObjLo );
            }
        }
    }
    ABC_FREE( pMapping );
    Aig_ManForEachLiSeq( p, pObj, i )
    {
        pFanin = Aig_ObjFanin0(pObj);
        pFanin->fMarkA = pFanin->fMarkB = 0;
    }
    return vMap;
}